

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O0

uint32_t __thiscall cppnet::BufferQueue::ReadNotMovePt(BufferQueue *this,char *res,uint32_t len)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  element_type *peVar4;
  ListSlot<cppnet::BufferBlock> local_60;
  undefined1 local_38 [4];
  uint32_t read_len;
  shared_ptr<cppnet::BufferBlock> temp;
  uint32_t len_local;
  char *res_local;
  BufferQueue *this_local;
  
  temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       len;
  uVar2 = List<cppnet::BufferBlock>::Size(&this->_buffer_list);
  if ((uVar2 == 0) || (res == (char *)0x0)) {
    this_local._4_4_ = 0;
  }
  else {
    List<cppnet::BufferBlock>::GetHead((List<cppnet::BufferBlock> *)local_38);
    local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = 0;
    while (bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38),
          bVar1 && local_60._next.
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._4_4_ <
                   temp.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi._4_4_) {
      peVar4 = std::
               __shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      iVar3 = (*(peVar4->super_InnerBuffer).super_Buffer._vptr_Buffer[2])
                        (peVar4,res + local_60._next.
                                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_refcount._M_pi._4_4_,
                         (ulong)(temp.
                                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi._4_4_ -
                                local_60._next.
                                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi._4_4_));
      local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._4_4_ = iVar3 + local_60._next.
                             super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi._4_4_;
      bVar1 = std::operator==((shared_ptr<cppnet::BufferBlock> *)local_38,&this->_buffer_write);
      if (bVar1) break;
      std::__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_38);
      ListSlot<cppnet::BufferBlock>::GetNext(&local_60);
      std::shared_ptr<cppnet::BufferBlock>::operator=
                ((shared_ptr<cppnet::BufferBlock> *)local_38,
                 (shared_ptr<cppnet::BufferBlock> *)&local_60);
      std::shared_ptr<cppnet::BufferBlock>::~shared_ptr
                ((shared_ptr<cppnet::BufferBlock> *)&local_60);
    }
    this_local._4_4_ =
         local_60._next.super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi._4_4_;
    std::shared_ptr<cppnet::BufferBlock>::~shared_ptr((shared_ptr<cppnet::BufferBlock> *)local_38);
  }
  return this_local._4_4_;
}

Assistant:

uint32_t BufferQueue::ReadNotMovePt(char* res, uint32_t len) {
    if (_buffer_list.Size() == 0 || !res) {
        return 0;
    }

    std::shared_ptr<BufferBlock> temp = _buffer_list.GetHead();
    uint32_t read_len = 0;
    while (temp && read_len < len) {
        read_len += temp->ReadNotMovePt(res + read_len, len - read_len);
        if (temp == _buffer_write) {
            break;
        }
        temp = temp->GetNext();
    }
    return read_len;
}